

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblock.h
# Opt level: O1

TPZFMatrix<std::complex<double>_> * __thiscall
TPZBlock::Matrix<std::complex<double>>(TPZBlock *this)

{
  TPZFMatrix<std::complex<double>_> *pTVar1;
  
  if (this->fpMatrix == (TPZBaseMatrix *)0x0) {
    pTVar1 = (TPZFMatrix<std::complex<double>_> *)0x0;
  }
  else {
    pTVar1 = (TPZFMatrix<std::complex<double>_> *)
             __dynamic_cast(this->fpMatrix,&TPZBaseMatrix::typeinfo,
                            &TPZFMatrix<std::complex<double>>::typeinfo,0);
  }
  if (pTVar1 == (TPZFMatrix<std::complex<double>_> *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Incompatible matrix type in ",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "const TPZFMatrix<TVar> *TPZBlock::Matrix() const [TVar = std::complex<double>]",0x4e
              );
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzblock.h",
               0x51);
  }
  return pTVar1;
}

Assistant:

const TPZFMatrix<TVar> *Matrix()const{
		if(auto tmp = dynamic_cast<const TPZFMatrix<TVar>*>(fpMatrix); tmp){
            return tmp;
        }
        else{
            PZError<<"Incompatible matrix type in ";
            PZError<<__PRETTY_FUNCTION__<<std::endl;
            DebugStop();
            return nullptr;
        }
	}